

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VulkanTypeConversions.cpp
# Opt level: O0

DeviceFeatures *
Diligent::VkFeaturesToDeviceFeatures
          (DeviceFeatures *__return_storage_ptr__,uint32_t vkVersion,
          VkPhysicalDeviceFeatures *vkFeatures,VkPhysicalDeviceProperties *vkDeviceProps,
          ExtensionFeatures *ExtFeatures,ExtensionProperties *ExtProps,
          DEVICE_FEATURE_STATE OptionalState)

{
  Char *Message;
  bool bVar1;
  DEVICE_FEATURE_STATE local_fe;
  DEVICE_FEATURE_STATE local_fd;
  DEVICE_FEATURE_STATE local_fc;
  DEVICE_FEATURE_STATE local_fb;
  DEVICE_FEATURE_STATE local_fa;
  DEVICE_FEATURE_STATE local_f6;
  DEVICE_FEATURE_STATE local_f5;
  DEVICE_FEATURE_STATE local_f4;
  DEVICE_FEATURE_STATE local_f3;
  DEVICE_FEATURE_STATE local_f2;
  DEVICE_FEATURE_STATE local_f1;
  DEVICE_FEATURE_STATE local_f0;
  DEVICE_FEATURE_STATE local_ef;
  DEVICE_FEATURE_STATE local_ee;
  DEVICE_FEATURE_STATE local_ed;
  DEVICE_FEATURE_STATE local_ec;
  DEVICE_FEATURE_STATE local_eb;
  DEVICE_FEATURE_STATE local_ea;
  DEVICE_FEATURE_STATE local_e9;
  DEVICE_FEATURE_STATE local_e8;
  DEVICE_FEATURE_STATE local_e7;
  DEVICE_FEATURE_STATE local_e6;
  DEVICE_FEATURE_STATE local_e5;
  DEVICE_FEATURE_STATE local_e4;
  DEVICE_FEATURE_STATE local_e3;
  DEVICE_FEATURE_STATE local_e2;
  DEVICE_FEATURE_STATE local_e1;
  DEVICE_FEATURE_STATE local_e0;
  DEVICE_FEATURE_STATE local_df;
  DEVICE_FEATURE_STATE local_de;
  DEVICE_FEATURE_STATE local_dd;
  VkPhysicalDeviceTimelineSemaphoreFeaturesKHR *TimelineSemaphoreFeats;
  VkPhysicalDeviceVertexAttributeDivisorFeaturesEXT *VertexAttribDivisorFeats;
  VkShaderStageFlagBits RequiredSubgroupStages;
  VkSubgroupFeatureFlagBits RequiredSubgroupFeats;
  VkPhysicalDeviceSubgroupProperties *SubgroupProps;
  VkPhysicalDeviceRayQueryFeaturesKHR *RayQueryFeats;
  VkPhysicalDeviceRayTracingPipelineFeaturesKHR *RayTracingFeats;
  VkPhysicalDeviceAccelerationStructureFeaturesKHR *AccelStructFeats;
  VkPhysicalDeviceDescriptorIndexingFeaturesEXT *DescrIndexingFeats;
  VkPhysicalDevice8BitStorageFeaturesKHR *Storage8BitFeats;
  VkPhysicalDevice16BitStorageFeaturesKHR *Storage16BitFeats;
  VkPhysicalDeviceShaderFloat16Int8FeaturesKHR *ShaderFloat16Int8Feats;
  VkPhysicalDeviceMeshShaderFeaturesEXT *MeshShaderFeats;
  undefined1 local_50 [8];
  string msg;
  ExtensionProperties *ExtProps_local;
  ExtensionFeatures *ExtFeatures_local;
  VkPhysicalDeviceProperties *vkDeviceProps_local;
  VkPhysicalDeviceFeatures *vkFeatures_local;
  uint32_t vkVersion_local;
  
  msg.field_2._8_8_ = ExtProps;
  if (OptionalState == DEVICE_FEATURE_STATE_DISABLED) {
    FormatString<char[26],char[47]>
              ((string *)local_50,(Diligent *)"Debug expression failed:\n",
               (char (*) [26])"OptionalState != DEVICE_FEATURE_STATE_DISABLED",
               (char (*) [47])vkDeviceProps);
    Message = (Char *)std::__cxx11::string::c_str();
    DebugAssertionFailed
              (Message,"VkFeaturesToDeviceFeatures",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/VulkanTypeConversions.cpp"
               ,0x79e);
    std::__cxx11::string::~string((string *)local_50);
  }
  DeviceFeatures::DeviceFeatures(__return_storage_ptr__);
  __return_storage_ptr__->SeparablePrograms = DEVICE_FEATURE_STATE_ENABLED;
  __return_storage_ptr__->ShaderResourceQueries = DEVICE_FEATURE_STATE_ENABLED;
  __return_storage_ptr__->MultithreadedResourceCreation = DEVICE_FEATURE_STATE_ENABLED;
  __return_storage_ptr__->ComputeShaders = DEVICE_FEATURE_STATE_ENABLED;
  __return_storage_ptr__->BindlessResources = DEVICE_FEATURE_STATE_ENABLED;
  __return_storage_ptr__->BinaryOcclusionQueries = DEVICE_FEATURE_STATE_ENABLED;
  __return_storage_ptr__->ShaderResourceStaticArrays = DEVICE_FEATURE_STATE_ENABLED;
  __return_storage_ptr__->SubpassFramebufferFetch = DEVICE_FEATURE_STATE_ENABLED;
  __return_storage_ptr__->TextureComponentSwizzle = DEVICE_FEATURE_STATE_ENABLED;
  __return_storage_ptr__->TextureSubresourceViews = DEVICE_FEATURE_STATE_ENABLED;
  __return_storage_ptr__->AsyncShaderCompilation = DEVICE_FEATURE_STATE_ENABLED;
  __return_storage_ptr__->FormattedBuffers = DEVICE_FEATURE_STATE_ENABLED;
  __return_storage_ptr__->TimestampQueries =
       (vkDeviceProps->limits).timestampComputeAndGraphics != 0;
  __return_storage_ptr__->DurationQueries = (vkDeviceProps->limits).timestampComputeAndGraphics != 0
  ;
  if (vkFeatures->geometryShader == 0) {
    local_dd = DEVICE_FEATURE_STATE_DISABLED;
  }
  else {
    local_dd = OptionalState;
  }
  __return_storage_ptr__->GeometryShaders = local_dd;
  if (vkFeatures->tessellationShader == 0) {
    local_de = DEVICE_FEATURE_STATE_DISABLED;
  }
  else {
    local_de = OptionalState;
  }
  __return_storage_ptr__->Tessellation = local_de;
  if (vkFeatures->pipelineStatisticsQuery == 0) {
    local_df = DEVICE_FEATURE_STATE_DISABLED;
  }
  else {
    local_df = OptionalState;
  }
  __return_storage_ptr__->PipelineStatisticsQueries = local_df;
  if (vkFeatures->occlusionQueryPrecise == 0) {
    local_e0 = DEVICE_FEATURE_STATE_DISABLED;
  }
  else {
    local_e0 = OptionalState;
  }
  __return_storage_ptr__->OcclusionQueries = local_e0;
  if (vkFeatures->fillModeNonSolid == 0) {
    local_e1 = DEVICE_FEATURE_STATE_DISABLED;
  }
  else {
    local_e1 = OptionalState;
  }
  __return_storage_ptr__->WireframeFill = local_e1;
  if (vkFeatures->depthBiasClamp == 0) {
    local_e2 = DEVICE_FEATURE_STATE_DISABLED;
  }
  else {
    local_e2 = OptionalState;
  }
  __return_storage_ptr__->DepthBiasClamp = local_e2;
  if (vkFeatures->depthClamp == 0) {
    local_e3 = DEVICE_FEATURE_STATE_DISABLED;
  }
  else {
    local_e3 = OptionalState;
  }
  __return_storage_ptr__->DepthClamp = local_e3;
  if (vkFeatures->independentBlend == 0) {
    local_e4 = DEVICE_FEATURE_STATE_DISABLED;
  }
  else {
    local_e4 = OptionalState;
  }
  __return_storage_ptr__->IndependentBlend = local_e4;
  if (vkFeatures->dualSrcBlend == 0) {
    local_e5 = DEVICE_FEATURE_STATE_DISABLED;
  }
  else {
    local_e5 = OptionalState;
  }
  __return_storage_ptr__->DualSourceBlend = local_e5;
  if (vkFeatures->multiViewport == 0) {
    local_e6 = DEVICE_FEATURE_STATE_DISABLED;
  }
  else {
    local_e6 = OptionalState;
  }
  __return_storage_ptr__->MultiViewport = local_e6;
  if (vkFeatures->textureCompressionBC == 0) {
    local_e7 = DEVICE_FEATURE_STATE_DISABLED;
  }
  else {
    local_e7 = OptionalState;
  }
  __return_storage_ptr__->TextureCompressionBC = local_e7;
  if (vkFeatures->textureCompressionETC2 == 0) {
    local_e8 = DEVICE_FEATURE_STATE_DISABLED;
  }
  else {
    local_e8 = OptionalState;
  }
  __return_storage_ptr__->TextureCompressionETC2 = local_e8;
  if (vkFeatures->vertexPipelineStoresAndAtomics == 0) {
    local_e9 = DEVICE_FEATURE_STATE_DISABLED;
  }
  else {
    local_e9 = OptionalState;
  }
  __return_storage_ptr__->VertexPipelineUAVWritesAndAtomics = local_e9;
  if (vkFeatures->fragmentStoresAndAtomics == 0) {
    local_ea = DEVICE_FEATURE_STATE_DISABLED;
  }
  else {
    local_ea = OptionalState;
  }
  __return_storage_ptr__->PixelUAVWritesAndAtomics = local_ea;
  if (vkFeatures->shaderStorageImageExtendedFormats == 0) {
    local_eb = DEVICE_FEATURE_STATE_DISABLED;
  }
  else {
    local_eb = OptionalState;
  }
  __return_storage_ptr__->TextureUAVExtendedFormats = local_eb;
  if ((vkFeatures->sparseBinding == 0) ||
     ((vkFeatures->sparseResidencyBuffer == 0 && (vkFeatures->sparseResidencyImage2D == 0)))) {
    local_ec = DEVICE_FEATURE_STATE_DISABLED;
  }
  else {
    local_ec = OptionalState;
  }
  __return_storage_ptr__->SparseResources = local_ec;
  if (((ExtFeatures->MeshShader).taskShader == 0) || ((ExtFeatures->MeshShader).meshShader == 0)) {
    local_ed = DEVICE_FEATURE_STATE_DISABLED;
  }
  else {
    local_ed = OptionalState;
  }
  __return_storage_ptr__->MeshShaders = local_ed;
  if ((ExtFeatures->ShaderFloat16Int8).shaderFloat16 == 0) {
    local_ee = DEVICE_FEATURE_STATE_DISABLED;
  }
  else {
    local_ee = OptionalState;
  }
  __return_storage_ptr__->ShaderFloat16 = local_ee;
  if ((ExtFeatures->ShaderFloat16Int8).shaderInt8 == 0) {
    local_ef = DEVICE_FEATURE_STATE_DISABLED;
  }
  else {
    local_ef = OptionalState;
  }
  __return_storage_ptr__->ShaderInt8 = local_ef;
  if (((ExtFeatures->Storage16Bit).storageBuffer16BitAccess == 0) || (vkFeatures->shaderInt16 == 0))
  {
    local_f0 = DEVICE_FEATURE_STATE_DISABLED;
  }
  else {
    local_f0 = OptionalState;
  }
  __return_storage_ptr__->ResourceBuffer16BitAccess = local_f0;
  if (((ExtFeatures->Storage16Bit).uniformAndStorageBuffer16BitAccess == 0) ||
     (vkFeatures->shaderInt16 == 0)) {
    local_f1 = DEVICE_FEATURE_STATE_DISABLED;
  }
  else {
    local_f1 = OptionalState;
  }
  __return_storage_ptr__->UniformBuffer16BitAccess = local_f1;
  if (((ExtFeatures->Storage16Bit).storageInputOutput16 == 0) || (vkFeatures->shaderInt16 == 0)) {
    local_f2 = DEVICE_FEATURE_STATE_DISABLED;
  }
  else {
    local_f2 = OptionalState;
  }
  __return_storage_ptr__->ShaderInputOutput16 = local_f2;
  if ((ExtFeatures->Storage8Bit).storageBuffer8BitAccess == 0) {
    local_f3 = DEVICE_FEATURE_STATE_DISABLED;
  }
  else {
    local_f3 = OptionalState;
  }
  __return_storage_ptr__->ResourceBuffer8BitAccess = local_f3;
  if ((ExtFeatures->Storage8Bit).uniformAndStorageBuffer8BitAccess == 0) {
    local_f4 = DEVICE_FEATURE_STATE_DISABLED;
  }
  else {
    local_f4 = OptionalState;
  }
  __return_storage_ptr__->UniformBuffer8BitAccess = local_f4;
  if ((ExtFeatures->DescriptorIndexing).runtimeDescriptorArray == 0) {
    local_f5 = DEVICE_FEATURE_STATE_DISABLED;
  }
  else {
    local_f5 = OptionalState;
  }
  __return_storage_ptr__->ShaderResourceRuntimeArrays = local_f5;
  if (((vkVersion < 0x401000) || ((ExtFeatures->AccelStruct).accelerationStructure == 0)) ||
     (((ExtFeatures->RayTracingPipeline).rayTracingPipeline == 0 &&
      ((ExtFeatures->RayQuery).rayQuery == 0)))) {
    local_f6 = DEVICE_FEATURE_STATE_DISABLED;
  }
  else {
    local_f6 = OptionalState;
  }
  __return_storage_ptr__->RayTracing = local_f6;
  bVar1 = false;
  if ((0x400fff < vkVersion) && (bVar1 = false, (*(uint *)(msg.field_2._8_8_ + 0x1b0) & 1) == 1)) {
    bVar1 = (*(uint *)(msg.field_2._8_8_ + 0x1ac) & 0x20) == 0x20;
  }
  __return_storage_ptr__->WaveOp = bVar1;
  if (((ExtFeatures->VertexAttributeDivisor).vertexAttributeInstanceRateDivisor == 0) ||
     ((ExtFeatures->VertexAttributeDivisor).vertexAttributeInstanceRateZeroDivisor == 0)) {
    local_fa = DEVICE_FEATURE_STATE_DISABLED;
  }
  else {
    local_fa = OptionalState;
  }
  __return_storage_ptr__->InstanceDataStepRate = local_fa;
  if ((ExtFeatures->TimelineSemaphore).timelineSemaphore == 0) {
    local_fb = DEVICE_FEATURE_STATE_DISABLED;
  }
  else {
    local_fb = OptionalState;
  }
  __return_storage_ptr__->NativeFence = local_fb;
  __return_storage_ptr__->TileShaders = DEVICE_FEATURE_STATE_DISABLED;
  if ((ExtFeatures->HostQueryReset).hostQueryReset == 0) {
    local_fc = DEVICE_FEATURE_STATE_DISABLED;
  }
  else {
    local_fc = OptionalState;
  }
  __return_storage_ptr__->TransferQueueTimestampQueries = local_fc;
  if (((((ExtFeatures->ShadingRate).pipelineFragmentShadingRate == 0) &&
       ((ExtFeatures->ShadingRate).primitiveFragmentShadingRate == 0)) &&
      ((ExtFeatures->ShadingRate).attachmentFragmentShadingRate == 0)) &&
     ((ExtFeatures->FragmentDensityMap).fragmentDensityMap == 0)) {
    local_fd = DEVICE_FEATURE_STATE_DISABLED;
  }
  else {
    local_fd = OptionalState;
  }
  __return_storage_ptr__->VariableRateShading = local_fd;
  if (((ExtFeatures->MultiDraw).multiDraw == 0) ||
     ((ExtFeatures->ShaderDrawParameters).shaderDrawParameters == 0)) {
    local_fe = DEVICE_FEATURE_STATE_DISABLED;
  }
  else {
    local_fe = OptionalState;
  }
  __return_storage_ptr__->NativeMultiDraw = local_fe;
  return __return_storage_ptr__;
}

Assistant:

DeviceFeatures VkFeaturesToDeviceFeatures(uint32_t                                                          vkVersion,
                                          const VkPhysicalDeviceFeatures&                                   vkFeatures,
                                          const VkPhysicalDeviceProperties&                                 vkDeviceProps,
                                          const VulkanUtilities::VulkanPhysicalDevice::ExtensionFeatures&   ExtFeatures,
                                          const VulkanUtilities::VulkanPhysicalDevice::ExtensionProperties& ExtProps,
                                          DEVICE_FEATURE_STATE                                              OptionalState)
{
    VERIFY_EXPR(OptionalState != DEVICE_FEATURE_STATE_DISABLED);

    DeviceFeatures Features;

    // Enable features
#define INIT_FEATURE(FeatureName, Supported) \
    Features.FeatureName = (Supported) ? OptionalState : DEVICE_FEATURE_STATE_DISABLED

    // The following features are always enabled
    Features.SeparablePrograms             = DEVICE_FEATURE_STATE_ENABLED;
    Features.ShaderResourceQueries         = DEVICE_FEATURE_STATE_ENABLED;
    Features.MultithreadedResourceCreation = DEVICE_FEATURE_STATE_ENABLED;
    Features.ComputeShaders                = DEVICE_FEATURE_STATE_ENABLED;
    Features.BindlessResources             = DEVICE_FEATURE_STATE_ENABLED;
    Features.BinaryOcclusionQueries        = DEVICE_FEATURE_STATE_ENABLED;
    Features.ShaderResourceStaticArrays    = DEVICE_FEATURE_STATE_ENABLED;
    Features.SubpassFramebufferFetch       = DEVICE_FEATURE_STATE_ENABLED;
    Features.TextureComponentSwizzle       = DEVICE_FEATURE_STATE_ENABLED;
    Features.TextureSubresourceViews       = DEVICE_FEATURE_STATE_ENABLED;
    Features.AsyncShaderCompilation        = DEVICE_FEATURE_STATE_ENABLED;
    Features.FormattedBuffers              = DEVICE_FEATURE_STATE_ENABLED;

    // Timestamps are not a feature and can't be disabled. They are either supported by the device, or not.
    Features.TimestampQueries = vkDeviceProps.limits.timestampComputeAndGraphics ? DEVICE_FEATURE_STATE_ENABLED : DEVICE_FEATURE_STATE_DISABLED;
    Features.DurationQueries  = vkDeviceProps.limits.timestampComputeAndGraphics ? DEVICE_FEATURE_STATE_ENABLED : DEVICE_FEATURE_STATE_DISABLED;

    // clang-format off
    INIT_FEATURE(GeometryShaders,                   vkFeatures.geometryShader);
    INIT_FEATURE(Tessellation,                      vkFeatures.tessellationShader);
    INIT_FEATURE(PipelineStatisticsQueries,         vkFeatures.pipelineStatisticsQuery);
    INIT_FEATURE(OcclusionQueries,                  vkFeatures.occlusionQueryPrecise);
    INIT_FEATURE(WireframeFill,                     vkFeatures.fillModeNonSolid);
    INIT_FEATURE(DepthBiasClamp,                    vkFeatures.depthBiasClamp);
    INIT_FEATURE(DepthClamp,                        vkFeatures.depthClamp);
    INIT_FEATURE(IndependentBlend,                  vkFeatures.independentBlend);
    INIT_FEATURE(DualSourceBlend,                   vkFeatures.dualSrcBlend);
    INIT_FEATURE(MultiViewport,                     vkFeatures.multiViewport);
    INIT_FEATURE(TextureCompressionBC,              vkFeatures.textureCompressionBC);
    INIT_FEATURE(TextureCompressionETC2,            vkFeatures.textureCompressionETC2);
    INIT_FEATURE(VertexPipelineUAVWritesAndAtomics, vkFeatures.vertexPipelineStoresAndAtomics);
    INIT_FEATURE(PixelUAVWritesAndAtomics,          vkFeatures.fragmentStoresAndAtomics);
    INIT_FEATURE(TextureUAVExtendedFormats,         vkFeatures.shaderStorageImageExtendedFormats);
    INIT_FEATURE(SparseResources,                   vkFeatures.sparseBinding && (vkFeatures.sparseResidencyBuffer || vkFeatures.sparseResidencyImage2D)); // requires support for resident resources
    // clang-format on

    const VkPhysicalDeviceMeshShaderFeaturesEXT& MeshShaderFeats = ExtFeatures.MeshShader;
    INIT_FEATURE(MeshShaders, MeshShaderFeats.taskShader != VK_FALSE && MeshShaderFeats.meshShader != VK_FALSE);

    const VkPhysicalDeviceShaderFloat16Int8FeaturesKHR& ShaderFloat16Int8Feats = ExtFeatures.ShaderFloat16Int8;
    // clang-format off
    INIT_FEATURE(ShaderFloat16, ShaderFloat16Int8Feats.shaderFloat16 != VK_FALSE);
    INIT_FEATURE(ShaderInt8,    ShaderFloat16Int8Feats.shaderInt8    != VK_FALSE);
    // clang-format on

    const VkPhysicalDevice16BitStorageFeaturesKHR& Storage16BitFeats = ExtFeatures.Storage16Bit;
    // clang-format off
    INIT_FEATURE(ResourceBuffer16BitAccess, Storage16BitFeats.storageBuffer16BitAccess           != VK_FALSE && vkFeatures.shaderInt16 != VK_FALSE);
    INIT_FEATURE(UniformBuffer16BitAccess,  Storage16BitFeats.uniformAndStorageBuffer16BitAccess != VK_FALSE && vkFeatures.shaderInt16 != VK_FALSE);
    INIT_FEATURE(ShaderInputOutput16,       Storage16BitFeats.storageInputOutput16               != VK_FALSE && vkFeatures.shaderInt16 != VK_FALSE);
    // clang-format on

    const VkPhysicalDevice8BitStorageFeaturesKHR& Storage8BitFeats = ExtFeatures.Storage8Bit;
    // clang-format off
    INIT_FEATURE(ResourceBuffer8BitAccess, Storage8BitFeats.storageBuffer8BitAccess           != VK_FALSE);
    INIT_FEATURE(UniformBuffer8BitAccess,  Storage8BitFeats.uniformAndStorageBuffer8BitAccess != VK_FALSE);
    // clang-format on

    const VkPhysicalDeviceDescriptorIndexingFeaturesEXT& DescrIndexingFeats = ExtFeatures.DescriptorIndexing;
    INIT_FEATURE(ShaderResourceRuntimeArrays, DescrIndexingFeats.runtimeDescriptorArray != VK_FALSE);
    const VkPhysicalDeviceAccelerationStructureFeaturesKHR& AccelStructFeats = ExtFeatures.AccelStruct;
    const VkPhysicalDeviceRayTracingPipelineFeaturesKHR&    RayTracingFeats  = ExtFeatures.RayTracingPipeline;
    const VkPhysicalDeviceRayQueryFeaturesKHR&              RayQueryFeats    = ExtFeatures.RayQuery;
    // clang-format off
    INIT_FEATURE(RayTracing,
                 vkVersion                              >= VK_API_VERSION_1_1 &&
                 AccelStructFeats.accelerationStructure != VK_FALSE           &&
                 (RayTracingFeats.rayTracingPipeline != VK_FALSE || RayQueryFeats.rayQuery != VK_FALSE));
    // clang-format on

    const VkPhysicalDeviceSubgroupProperties& SubgroupProps          = ExtProps.Subgroup;
    const VkSubgroupFeatureFlagBits           RequiredSubgroupFeats  = VK_SUBGROUP_FEATURE_BASIC_BIT;
    const VkShaderStageFlagBits               RequiredSubgroupStages = VK_SHADER_STAGE_COMPUTE_BIT;
    Features.WaveOp =
        (vkVersion >= VK_API_VERSION_1_1 &&
         (SubgroupProps.supportedOperations & RequiredSubgroupFeats) == RequiredSubgroupFeats &&
         (SubgroupProps.supportedStages & RequiredSubgroupStages) == RequiredSubgroupStages) ?
        DEVICE_FEATURE_STATE_ENABLED :
        DEVICE_FEATURE_STATE_DISABLED;

    const VkPhysicalDeviceVertexAttributeDivisorFeaturesEXT& VertexAttribDivisorFeats = ExtFeatures.VertexAttributeDivisor;
    INIT_FEATURE(InstanceDataStepRate,
                 (VertexAttribDivisorFeats.vertexAttributeInstanceRateDivisor != VK_FALSE &&
                  VertexAttribDivisorFeats.vertexAttributeInstanceRateZeroDivisor != VK_FALSE));

    const VkPhysicalDeviceTimelineSemaphoreFeaturesKHR& TimelineSemaphoreFeats = ExtFeatures.TimelineSemaphore;
    INIT_FEATURE(NativeFence,
                 TimelineSemaphoreFeats.timelineSemaphore != VK_FALSE);

    INIT_FEATURE(TileShaders, false); // Not currently supported

    INIT_FEATURE(TransferQueueTimestampQueries,
                 ExtFeatures.HostQueryReset.hostQueryReset != VK_FALSE);

    INIT_FEATURE(VariableRateShading,
                 (ExtFeatures.ShadingRate.pipelineFragmentShadingRate != VK_FALSE ||
                  ExtFeatures.ShadingRate.primitiveFragmentShadingRate != VK_FALSE ||
                  ExtFeatures.ShadingRate.attachmentFragmentShadingRate != VK_FALSE ||
                  ExtFeatures.FragmentDensityMap.fragmentDensityMap != VK_FALSE));

    INIT_FEATURE(NativeMultiDraw,
                 ExtFeatures.MultiDraw.multiDraw != VK_FALSE && ExtFeatures.ShaderDrawParameters.shaderDrawParameters != VK_FALSE);

#undef INIT_FEATURE

    ASSERT_SIZEOF(DeviceFeatures, 47, "Did you add a new feature to DeviceFeatures? Please handle its status here (if necessary).");

    return Features;
}